

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnAlgebraicCon
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int index,
          NumericExpr expr)

{
  MutAlgebraicCon local_18;
  
  BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::MutAlgebraicCon
            (&local_18,this->builder_,index);
  if (expr.super_ExprBase.impl_ != (Impl *)0x0) {
    BasicProblem<mp::BasicProblemParams<int>_>::SetNonlinearConExpr
              (local_18.
               super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_,
               local_18.
               super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_,
               (NumericExpr)expr.super_ExprBase.impl_);
  }
  return;
}

Assistant:

void OnAlgebraicCon(int index, NumericExpr expr) {
    builder_.algebraic_con(index).set_nonlinear_expr(expr);
  }